

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiWindow *window;
  ImGuiColumnData *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiID id;
  ImGuiColumns *pIVar6;
  ImGuiColumnData *pIVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int n;
  long lVar11;
  int iVar12;
  ImGuiContext *g;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  
  pIVar5 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1db0,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((window->DC).CurrentColumns == (ImGuiColumns *)0x0) {
    id = GetColumnsID(str_id,columns_count);
    pIVar6 = FindOrCreateColumns(window,id);
    if (pIVar6->ID != id) {
      __assert_fail("columns->ID == id",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x1db6,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
    }
    pIVar6->Current = 0;
    pIVar6->Count = columns_count;
    pIVar6->Flags = flags;
    (window->DC).CurrentColumns = pIVar6;
    pIVar6->HostCursorPosY = (window->DC).CursorPos.y;
    pIVar6->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
    IVar2 = (window->ClipRect).Max;
    (pIVar6->HostClipRect).Min = (window->ClipRect).Min;
    (pIVar6->HostClipRect).Max = IVar2;
    IVar2 = (window->WorkRect).Max;
    (pIVar6->HostWorkRect).Min = (window->WorkRect).Min;
    (pIVar6->HostWorkRect).Max = IVar2;
    fVar1 = (pIVar5->Style).ItemSpacing.x;
    fVar16 = (window->WindowPadding).x;
    fVar18 = fVar1 - fVar16;
    fVar16 = fVar16 * 0.5;
    uVar15 = -(uint)(window->WindowBorderSize <= fVar16);
    fVar17 = (window->WorkRect).Max.x;
    fVar18 = (float)(-(uint)(0.0 <= fVar18) & (uint)fVar18);
    fVar21 = (fVar1 + fVar17) - fVar18;
    fVar17 = (float)(int)(float)(~uVar15 & (uint)window->WindowBorderSize | (uint)fVar16 & uVar15) +
             fVar17;
    if (fVar17 <= fVar21) {
      fVar21 = fVar17;
    }
    fVar18 = ((window->DC).Indent.x - fVar1) + fVar18;
    pIVar6->OffMinX = fVar18;
    fVar21 = fVar21 - (window->Pos).x;
    fVar18 = fVar18 + 1.0;
    uVar15 = -(uint)(fVar18 <= fVar21);
    pIVar6->OffMaxX = (float)(~uVar15 & (uint)fVar18 | (uint)fVar21 & uVar15);
    fVar16 = (window->DC).CursorPos.y;
    pIVar6->LineMaxY = fVar16;
    pIVar6->LineMinY = fVar16;
    uVar15 = (pIVar6->Columns).Size;
    uVar9 = columns_count + 1;
    if (uVar15 != uVar9 && uVar15 != 0) {
      iVar12 = (pIVar6->Columns).Capacity;
      if (iVar12 < 0) {
        uVar15 = iVar12 / 2 + iVar12;
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        pIVar7 = (ImGuiColumnData *)MemAlloc(uVar10 * 0x1c);
        pIVar4 = (pIVar6->Columns).Data;
        if (pIVar4 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar7,pIVar4,(long)(pIVar6->Columns).Size * 0x1c);
          MemFree((pIVar6->Columns).Data);
        }
        (pIVar6->Columns).Data = pIVar7;
        (pIVar6->Columns).Capacity = (int)uVar10;
      }
      (pIVar6->Columns).Size = 0;
    }
    bVar14 = (pIVar6->Columns).Size == 0;
    pIVar6->IsFirstFrame = bVar14;
    if (bVar14) {
      if ((pIVar6->Columns).Capacity <= columns_count) {
        pIVar7 = (ImGuiColumnData *)MemAlloc((ulong)uVar9 * 0x1c);
        pIVar4 = (pIVar6->Columns).Data;
        if (pIVar4 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar7,pIVar4,(long)(pIVar6->Columns).Size * 0x1c);
          MemFree((pIVar6->Columns).Data);
        }
        (pIVar6->Columns).Data = pIVar7;
        (pIVar6->Columns).Capacity = uVar9;
      }
      uVar15 = 0;
      do {
        iVar12 = (pIVar6->Columns).Size;
        iVar3 = (pIVar6->Columns).Capacity;
        if (iVar12 == iVar3) {
          if (iVar3 == 0) {
            iVar8 = 8;
          }
          else {
            iVar8 = iVar3 / 2 + iVar3;
          }
          iVar12 = iVar12 + 1;
          if (iVar12 < iVar8) {
            iVar12 = iVar8;
          }
          if (iVar3 < iVar12) {
            pIVar7 = (ImGuiColumnData *)MemAlloc((long)iVar12 * 0x1c);
            pIVar4 = (pIVar6->Columns).Data;
            if (pIVar4 != (ImGuiColumnData *)0x0) {
              memcpy(pIVar7,pIVar4,(long)(pIVar6->Columns).Size * 0x1c);
              MemFree((pIVar6->Columns).Data);
            }
            (pIVar6->Columns).Data = pIVar7;
            (pIVar6->Columns).Capacity = iVar12;
          }
        }
        pIVar4 = (pIVar6->Columns).Data;
        iVar12 = (pIVar6->Columns).Size;
        pIVar4[iVar12].OffsetNorm = (float)(int)uVar15 / (float)columns_count;
        pIVar7 = pIVar4 + iVar12;
        pIVar7->OffsetNormBeforeResize = 0.0;
        pIVar7->Flags = 0;
        (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).x = 0.0;
        (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).y = 0.0;
        pIVar4[iVar12].ClipRect.Max.x = 0.0;
        pIVar4[iVar12].ClipRect.Max.y = 0.0;
        (pIVar6->Columns).Size = (pIVar6->Columns).Size + 1;
        uVar15 = uVar15 + 1;
      } while (uVar9 != uVar15);
    }
    uVar10 = 1;
    if (1 < columns_count) {
      uVar10 = (ulong)(uint)columns_count;
    }
    lVar11 = 0xc;
    uVar13 = 0;
    do {
      if ((long)(pIVar6->Columns).Size <= (long)uVar13) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                      ,0x52e,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
      }
      pIVar4 = (pIVar6->Columns).Data;
      fVar16 = (window->Pos).x;
      fVar17 = GetColumnOffset((int)uVar13);
      fVar17 = (float)(int)(fVar17 + fVar16 + 0.5);
      fVar16 = (window->Pos).x;
      uVar13 = uVar13 + 1;
      fVar21 = GetColumnOffset((int)uVar13);
      fVar16 = (float)(int)(fVar21 + fVar16 + -1.0 + 0.5);
      *(float *)((long)&pIVar4->OffsetNorm + lVar11) = fVar17;
      *(undefined4 *)((long)&pIVar4->OffsetNormBeforeResize + lVar11) = 0xff7fffff;
      *(float *)((long)&pIVar4->Flags + lVar11) = fVar16;
      *(undefined4 *)((long)&(pIVar4->ClipRect).Min.x + lVar11) = 0x7f7fffff;
      IVar2 = (window->ClipRect).Min;
      fVar21 = IVar2.x;
      fVar18 = IVar2.y;
      uVar15 = -(uint)(fVar21 <= fVar17);
      uVar9 = -(uint)(fVar18 <= -3.4028235e+38);
      *(ulong *)((long)&pIVar4->OffsetNorm + lVar11) =
           CONCAT44(~uVar9 & (uint)fVar18,~uVar15 & (uint)fVar21) |
           CONCAT44(uVar9,(uint)fVar17 & uVar15) & 0xff7fffffffffffff;
      auVar20._8_8_ = 0;
      auVar20._0_4_ = (window->ClipRect).Max.x;
      auVar20._4_4_ = (window->ClipRect).Max.y;
      auVar19._4_4_ = 0x7f7fffff;
      auVar19._0_4_ = fVar16;
      auVar19._8_8_ = 0;
      auVar20 = minps(auVar19,auVar20);
      *(long *)((long)&pIVar4->Flags + lVar11) = auVar20._0_8_;
      lVar11 = lVar11 + 0x1c;
    } while (uVar10 != uVar13);
    if (1 < pIVar6->Count) {
      ImDrawListSplitter::Split(&pIVar6->Splitter,window->DrawList,pIVar6->Count + 1);
      ImDrawListSplitter::SetCurrentChannel(&pIVar6->Splitter,window->DrawList,1);
      PushColumnClipRect(0);
    }
    fVar16 = GetColumnOffset(pIVar6->Current);
    fVar17 = GetColumnOffset(pIVar6->Current + 1);
    PushItemWidth((fVar17 - fVar16) * 0.65);
    fVar21 = fVar1 - (window->WindowPadding).x;
    fVar21 = (float)(-(uint)(0.0 <= fVar21) & (uint)fVar21);
    (window->DC).ColumnsOffset.x = fVar21;
    fVar16 = (window->Pos).x;
    (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar16 + fVar21);
    (window->WorkRect).Max.x = (fVar17 + fVar16) - fVar1;
    return;
  }
  __assert_fail("window->DC.CurrentColumns == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                ,0x1db1,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}